

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Client::redirect(Client *this,Request *req,Response *res)

{
  bool bVar1;
  __type_conflict _Var2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  const_reference pvVar6;
  string *in_R8;
  string *path;
  undefined1 local_290 [8];
  Client cli_1;
  SSLClient cli;
  string_type next_path;
  string_type next_host;
  string_type next_scheme;
  smatch m;
  char *scheme;
  undefined1 local_70 [8];
  regex re;
  undefined1 local_48 [8];
  string location;
  Response *res_local;
  Request *req_local;
  Client *this_local;
  
  if (req->redirect_count == 0) {
    this_local._7_1_ = false;
  }
  else {
    location.field_2._8_8_ = res;
    Response::get_header_value_abi_cxx11_((string *)local_48,res,"location",0);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_70,
                 "^(?:([^:/?#]+):)?(?://([^/?#]*))?([^?#]*(?:\\?[^#]*)?)(?:#.*)?",0x10);
      uVar3 = (*this->_vptr_Client[4])();
      pcVar5 = "http";
      if ((uVar3 & 1) != 0) {
        pcVar5 = "https";
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)((long)&next_scheme.field_2 + 8));
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)((long)&next_scheme.field_2 + 8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_70,0);
      if (bVar1) {
        pvVar6 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&next_scheme.field_2 + 8),1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_host.field_2 + 8),pvVar6);
        pvVar6 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&next_scheme.field_2 + 8),2);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_path.field_2 + 8),pvVar6);
        pvVar6 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&next_scheme.field_2 + 8),3);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)&cli.verify_result_,pvVar6);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)(next_path.field_2._M_local_buf + 8),(string *)&this->host_);
        }
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&cli.verify_result_,"/");
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&next_host.field_2 + 8),pcVar5);
        if ((bVar1) &&
           (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&next_path.field_2 + 8),&this->host_), _Var2)) {
          this_local._7_1_ =
               detail::redirect<httplib::Client>
                         ((detail *)this,(Client *)req,(Request *)location.field_2._8_8_,
                          (Response *)&cli.verify_result_,in_R8);
          re._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_ = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&next_host.field_2 + 8),"https");
          if (bVar1) {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            path = (string *)0x0;
            SSLClient::SSLClient
                      ((SSLClient *)&cli_1.follow_location_,pcVar5,0x1bb,300,(char *)0x0,(char *)0x0
                      );
            follow_location((Client *)&cli_1.follow_location_,true);
            this_local._7_1_ =
                 detail::redirect<httplib::SSLClient>
                           ((detail *)&cli_1.follow_location_,(SSLClient *)req,
                            (Request *)location.field_2._8_8_,(Response *)&cli.verify_result_,path);
            re._M_automaton.
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 1;
            SSLClient::~SSLClient((SSLClient *)&cli_1.follow_location_);
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Client((Client *)local_290,pcVar5,0x50,300);
            follow_location((Client *)local_290,true);
            this_local._7_1_ =
                 detail::redirect<httplib::Client>
                           ((detail *)local_290,(Client *)req,(Request *)location.field_2._8_8_,
                            (Response *)&cli.verify_result_,in_R8);
            re._M_automaton.
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 1;
            ~Client((Client *)local_290);
          }
        }
        std::__cxx11::string::~string((string *)&cli.verify_result_);
        std::__cxx11::string::~string((string *)(next_path.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(next_host.field_2._M_local_buf + 8));
      }
      else {
        this_local._7_1_ = false;
        re._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = 1;
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&next_scheme.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_70);
    }
    else {
      this_local._7_1_ = false;
      re._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

inline bool Client::redirect(const Request &req, Response &res) {
  if (req.redirect_count == 0) { return false; }

  auto location = res.get_header_value("location");
  if (location.empty()) { return false; }

  std::regex re(
      R"(^(?:([^:/?#]+):)?(?://([^/?#]*))?([^?#]*(?:\?[^#]*)?)(?:#.*)?)");

  auto scheme = is_ssl() ? "https" : "http";

  std::smatch m;
  if (regex_match(location, m, re)) {
    auto next_scheme = m[1].str();
    auto next_host = m[2].str();
    auto next_path = m[3].str();
    if (next_host.empty()) { next_host = host_; }
    if (next_path.empty()) { next_path = "/"; }

    if (next_scheme == scheme && next_host == host_) {
      return detail::redirect(*this, req, res, next_path);
    } else {
      if (next_scheme == "https") {
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        SSLClient cli(next_host.c_str());
        cli.follow_location(true);
        return detail::redirect(cli, req, res, next_path);
#else
        return false;
#endif
      } else {
        Client cli(next_host.c_str());
        cli.follow_location(true);
        return detail::redirect(cli, req, res, next_path);
      }
    }
  }
  return false;
}